

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefVectorOf<xercesc_4_0::IC_Field> *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  IC_Field *t;
  IC_Field *serObj;
  IC_Field *data;
  XMLSize_t i;
  XMLSize_t vectorLength;
  XSerializeEngine *serEng_local;
  RefVectorOf<xercesc_4_0::IC_Field> *objToStore_local;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    t = (IC_Field *)
        BaseRefVectorOf<xercesc_4_0::IC_Field>::size
                  (&objToStore->super_BaseRefVectorOf<xercesc_4_0::IC_Field>);
    XSerializeEngine::writeSize(serEng,(XMLSize_t)t);
    for (data = (IC_Field *)0x0; data < t;
        data = (IC_Field *)((long)&(data->super_XSerializable)._vptr_XSerializable + 1)) {
      serObj = BaseRefVectorOf<xercesc_4_0::IC_Field>::elementAt
                         (&objToStore->super_BaseRefVectorOf<xercesc_4_0::IC_Field>,(XMLSize_t)data)
      ;
      operator<<(serEng,&serObj->super_XSerializable);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefVectorOf<IC_Field>* const objToStore
                                    , XSerializeEngine&            serEng)
{

    if (serEng.needToStoreObject(objToStore))
    {
        XMLSize_t vectorLength = objToStore->size();
        serEng.writeSize (vectorLength);

        for ( XMLSize_t i = 0; i < vectorLength; i++)
        {
            IC_Field* data = objToStore->elementAt(i);
            serEng<<data;
        }
    }

}